

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_specific.cc
# Opt level: O3

void highwayhash::PinThreadToCPU(int cpu)

{
  __cpu_mask *p_Var1;
  ThreadAffinity affinity;
  ThreadAffinity local_88;
  
  local_88.set.__bits[0xe] = 0;
  local_88.set.__bits[0xf] = 0;
  local_88.set.__bits[0xc] = 0;
  local_88.set.__bits[0xd] = 0;
  local_88.set.__bits[10] = 0;
  local_88.set.__bits[0xb] = 0;
  local_88.set.__bits[8] = 0;
  local_88.set.__bits[9] = 0;
  local_88.set.__bits[6] = 0;
  local_88.set.__bits[7] = 0;
  local_88.set.__bits[4] = 0;
  local_88.set.__bits[5] = 0;
  local_88.set.__bits[2] = 0;
  local_88.set.__bits[3] = 0;
  local_88.set.__bits[0] = 0;
  local_88.set.__bits[1] = 0;
  if ((uint)cpu < 0x400) {
    p_Var1 = local_88.set.__bits + ((uint)cpu >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)cpu & 0x3f);
  }
  SetThreadAffinity(&local_88);
  return;
}

Assistant:

void PinThreadToCPU(const int cpu) {
  ThreadAffinity affinity;
#if OS_WIN
  affinity.mask = 1ULL << cpu;
#elif OS_LINUX
  CPU_ZERO(&affinity.set);
  CPU_SET(cpu, &affinity.set);
#elif OS_FREEBSD
  CPU_ZERO(&affinity.set);
  CPU_SET(cpu, &affinity.set);
#elif OS_MAC
  CPU_ZERO(&affinity.set);
  CPU_SET(cpu, &affinity.set);
#else
#error "port"
#endif
  SetThreadAffinity(&affinity);
}